

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

R QHashPrivate::Data<QHashPrivate::Node<int,_unsigned_int>_>::allocateSpans(size_t numBuckets)

{
  undefined4 *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  R RVar5;
  
  uVar4 = numBuckets >> 7;
  puVar2 = (ulong *)operator_new__(uVar4 * 0x90 + 8);
  *puVar2 = uVar4;
  if (0x7f < numBuckets) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)puVar2 + lVar3 + 0x88) = 0;
      *(undefined2 *)((long)puVar2 + lVar3 + 0x90) = 0;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 8);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x18);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x28);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x38);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x48);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x58);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x68);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      puVar1 = (undefined4 *)((long)puVar2 + lVar3 + 0x78);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      lVar3 = lVar3 + 0x90;
    } while (uVar4 * 0x90 - lVar3 != 0);
  }
  RVar5.nSpans = uVar4;
  RVar5.spans = (Span *)(puVar2 + 1);
  return RVar5;
}

Assistant:

static auto allocateSpans(size_t numBuckets)
    {
        struct R {
            Span *spans;
            size_t nSpans;
        };

        constexpr qptrdiff MaxSpanCount = (std::numeric_limits<qptrdiff>::max)() / sizeof(Span);
        constexpr size_t MaxBucketCount = MaxSpanCount << SpanConstants::SpanShift;

        if (numBuckets > MaxBucketCount) {
            Q_CHECK_PTR(false);
            Q_UNREACHABLE();    // no exceptions and no assertions -> no error reporting
        }

        size_t nSpans = numBuckets >> SpanConstants::SpanShift;
        return R{ new Span[nSpans], nSpans };
    }